

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BadStateCase::iterate(BadStateCase *this)

{
  undefined *puVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  TestLog *pTVar4;
  ProgramSources *pPVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  undefined4 *local_680;
  Enum<int,_2UL> local_5e0;
  MessageBuilder local_5d0;
  undefined4 local_450;
  undefined4 local_44c;
  DrawElementsCommand drawCommand;
  deInt32 posLocation;
  deUint32 programID;
  deUint32 cmdBufferID;
  deUint32 indexBufferID;
  deUint32 dataBufferID;
  deUint32 vaoID;
  ShaderSource local_400;
  allocator<char> local_3d1;
  string local_3d0;
  ShaderSource local_3b0;
  ProgramSources local_378;
  undefined1 local_2a8 [8];
  ShaderProgram program;
  deUint32 error;
  undefined1 local_1c0 [8];
  GLContext gl;
  deUint16 indices [3];
  Vec4 vertexPositions [3];
  BadStateCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)indices,0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertexPositions[0].m_data + 2),1.0,0.0,0.0,1.0)
  ;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertexPositions[1].m_data + 2),0.0,1.0,0.0,1.0)
  ;
  gl.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 1;
  gl.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x20000;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&stack0xfffffffffffffe30,0,0,1,1);
  sglr::GLContext::GLContext
            ((GLContext *)local_1c0,pRVar3,pTVar4,1,(Vector<int,_4> *)&stack0xfffffffffffffe30);
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_378);
  puVar1 = Functional::(anonymous_namespace)::s_commonVertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,puVar1,&local_3d1);
  glu::VertexSource::VertexSource((VertexSource *)&local_3b0,&local_3d0);
  pPVar5 = glu::ProgramSources::operator<<(&local_378,&local_3b0);
  puVar1 = Functional::(anonymous_namespace)::s_commonFragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vaoID,puVar1,(allocator<char> *)((long)&dataBufferID + 3));
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_400,(string *)&vaoID);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,&local_400);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2a8,pRVar3,pPVar5);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_400);
  std::__cxx11::string::~string((string *)&vaoID);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dataBufferID + 3));
  glu::VertexSource::~VertexSource((VertexSource *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  glu::ProgramSources::~ProgramSources(&local_378);
  indexBufferID = 0;
  cmdBufferID = 0;
  programID = 0;
  posLocation = 0;
  drawCommand.reservedMustBeZero = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a8);
  drawCommand.baseVertex =
       sglr::GLContext::getAttribLocation
                 ((GLContext *)local_1c0,drawCommand.reservedMustBeZero,"a_position");
  local_450 = 3;
  local_44c = 1;
  drawCommand.count = 0;
  drawCommand.primCount = 0;
  drawCommand.firstIndex = 0;
  dVar2 = sglr::GLContext::getError((GLContext *)local_1c0);
  glu::checkError(dVar2,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x9ba);
  if (this->m_caseType == CASE_CLIENT_BUFFER_VERTEXATTR) {
    sglr::GLContext::vertexAttribPointer
              ((GLContext *)local_1c0,drawCommand.baseVertex,4,0x1406,0,0,indices);
    sglr::GLContext::enableVertexAttribArray((GLContext *)local_1c0,drawCommand.baseVertex);
    dVar2 = sglr::GLContext::getError((GLContext *)local_1c0);
    glu::checkError(dVar2,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x9c2);
  }
  else if (this->m_caseType == CASE_CLIENT_BUFFER_COMMAND) {
    sglr::GLContext::genVertexArrays((GLContext *)local_1c0,1,&indexBufferID);
    sglr::GLContext::bindVertexArray((GLContext *)local_1c0,indexBufferID);
    sglr::GLContext::genBuffers((GLContext *)local_1c0,1,&cmdBufferID);
    sglr::GLContext::bindBuffer((GLContext *)local_1c0,0x8892,cmdBufferID);
    sglr::GLContext::bufferData((GLContext *)local_1c0,0x8892,0x30,indices,0x88e4);
    sglr::GLContext::vertexAttribPointer
              ((GLContext *)local_1c0,drawCommand.baseVertex,4,0x1406,0,0,(void *)0x0);
    sglr::GLContext::enableVertexAttribArray((GLContext *)local_1c0,drawCommand.baseVertex);
    dVar2 = sglr::GLContext::getError((GLContext *)local_1c0);
    glu::checkError(dVar2,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x9ce);
  }
  else if (this->m_caseType == CASE_DEFAULT_VAO) {
    sglr::GLContext::genBuffers((GLContext *)local_1c0,1,&cmdBufferID);
    sglr::GLContext::bindBuffer((GLContext *)local_1c0,0x8892,cmdBufferID);
    sglr::GLContext::bufferData((GLContext *)local_1c0,0x8892,0x30,indices,0x88e4);
    sglr::GLContext::vertexAttribPointer
              ((GLContext *)local_1c0,drawCommand.baseVertex,4,0x1406,0,0,(void *)0x0);
    sglr::GLContext::enableVertexAttribArray((GLContext *)local_1c0,drawCommand.baseVertex);
    dVar2 = sglr::GLContext::getError((GLContext *)local_1c0);
    glu::checkError(dVar2,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x9d7);
  }
  sglr::GLContext::genBuffers((GLContext *)local_1c0,1,&programID);
  sglr::GLContext::bindBuffer((GLContext *)local_1c0,0x8893,programID);
  sglr::GLContext::bufferData
            ((GLContext *)local_1c0,0x8893,6,
             &gl.m_programs.
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0x88e4);
  dVar2 = sglr::GLContext::getError((GLContext *)local_1c0);
  glu::checkError(dVar2,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x9df);
  if (this->m_caseType != CASE_CLIENT_BUFFER_COMMAND) {
    sglr::GLContext::genBuffers((GLContext *)local_1c0,1,(deUint32 *)&posLocation);
    sglr::GLContext::bindBuffer((GLContext *)local_1c0,0x8f3f,posLocation);
    sglr::GLContext::bufferData((GLContext *)local_1c0,0x8f3f,0x14,&local_450,0x88e4);
    dVar2 = sglr::GLContext::getError((GLContext *)local_1c0);
    glu::checkError(dVar2,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x9e6);
  }
  sglr::GLContext::viewport((GLContext *)local_1c0,0,0,1,1);
  sglr::GLContext::useProgram((GLContext *)local_1c0,drawCommand.reservedMustBeZero);
  if (this->m_caseType == CASE_CLIENT_BUFFER_COMMAND) {
    local_680 = &local_450;
  }
  else {
    local_680 = (undefined4 *)0x0;
  }
  sglr::GLContext::drawElementsIndirect((GLContext *)local_1c0,4,0x1403,local_680);
  program.m_program.m_info.linkTimeUs._4_4_ = sglr::GLContext::getError((GLContext *)local_1c0);
  sglr::GLContext::bindVertexArray((GLContext *)local_1c0,0);
  sglr::GLContext::useProgram((GLContext *)local_1c0,0);
  if (program.m_program.m_info.linkTimeUs._4_4_ == 0x502) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_5d0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_5d0,
                        (char (*) [54])"Unexpected error. Expected GL_INVALID_OPERATION, got ");
    EVar7 = glu::getErrorStr(program.m_program.m_info.linkTimeUs._4_4_);
    local_5e0.m_getName = EVar7.m_getName;
    local_5e0.m_value = EVar7.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_5e0);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5d0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got unexpected error.");
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2a8);
  sglr::GLContext::~GLContext((GLContext *)local_1c0);
  return STOP;
}

Assistant:

BadStateCase::IterateResult BadStateCase::iterate (void)
{
	const tcu::Vec4 vertexPositions[] =
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
	};

	const deUint16 indices[] =
	{
		0, 2, 1,
	};

	sglr::GLContext gl(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(0, 0, 1, 1));

	deUint32			error;
	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_commonVertexShaderSource) << glu::FragmentSource(s_commonFragmentShaderSource));
	deUint32			vaoID			= 0;
	deUint32			dataBufferID	= 0;
	deUint32			indexBufferID	= 0;
	deUint32			cmdBufferID		= 0;

	const deUint32		programID		= program.getProgram();
	const deInt32		posLocation		= gl.getAttribLocation(programID, "a_position");

	DrawElementsCommand drawCommand;
	drawCommand.count				= 3;
	drawCommand.primCount			= 1;
	drawCommand.firstIndex			= 0;
	drawCommand.baseVertex			= 0;
	drawCommand.reservedMustBeZero	= 0;

	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	if (m_caseType == CASE_CLIENT_BUFFER_VERTEXATTR)
	{
		// \note We use default VAO since we use client pointers. Trying indirect draw with default VAO is also an error. => This test does two illegal operations

		gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, vertexPositions);
		gl.enableVertexAttribArray(posLocation);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}
	else if (m_caseType == CASE_CLIENT_BUFFER_COMMAND)
	{
		gl.genVertexArrays(1, &vaoID);
		gl.bindVertexArray(vaoID);

		gl.genBuffers(1, &dataBufferID);
		gl.bindBuffer(GL_ARRAY_BUFFER, dataBufferID);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
		gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.enableVertexAttribArray(posLocation);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}
	else if (m_caseType == CASE_DEFAULT_VAO)
	{
		gl.genBuffers(1, &dataBufferID);
		gl.bindBuffer(GL_ARRAY_BUFFER, dataBufferID);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
		gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.enableVertexAttribArray(posLocation);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}
	else
		DE_ASSERT(DE_FALSE);

	gl.genBuffers(1, &indexBufferID);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBufferID);
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(indices), indices, GL_STATIC_DRAW);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	if (m_caseType != CASE_CLIENT_BUFFER_COMMAND)
	{
		gl.genBuffers(1, &cmdBufferID);
		gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, cmdBufferID);
		gl.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}

	gl.viewport(0, 0, 1, 1);

	gl.useProgram(programID);
	gl.drawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, (m_caseType != CASE_CLIENT_BUFFER_COMMAND) ? (DE_NULL) : (&drawCommand));

	error = gl.getError();

	gl.bindVertexArray(0);
	gl.useProgram(0);

	if (error == GL_INVALID_OPERATION)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Unexpected error. Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got unexpected error.");
	}

	return STOP;
}